

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void init_frame(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,int stackpos,int stacktop
               )

{
  int iVar1;
  sljit_compiler *compiler;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  sljit_u8 *psVar7;
  compiler_common *common_00;
  uint uVar8;
  long lVar10;
  int iVar11;
  compiler_common *pcVar12;
  ulong uVar9;
  
  compiler = common->compiler;
  common_00 = (compiler_common *)cc;
  pcVar12 = (compiler_common *)cc;
  if (ccend == (PCRE2_SPTR16)0x0) {
    do {
      ccend = (PCRE2_SPTR16)
              ((long)&pcVar12->compiler + (ulong)*(ushort *)((long)&pcVar12->compiler + 2) * 2);
      pcVar12 = (compiler_common *)ccend;
    } while (*(PCRE2_UCHAR16 *)&((compiler_common *)ccend)->compiler == 0x78);
    if ((*cc != 0x86) && (*cc != 0x8b)) {
      common_00 = (compiler_common *)next_opcode((compiler_common *)cc,cc);
    }
  }
  iVar11 = stackpos << 3;
  if (common_00 < ccend) {
    bVar5 = false;
    bVar2 = false;
    bVar4 = false;
    do {
      uVar8 = *(ushort *)&common_00->compiler - 0x75;
      uVar9 = (ulong)uVar8;
      lVar10 = (long)iVar11;
      bVar3 = true;
      if (uVar8 < 0x2a) {
        if ((0x630000UL >> (uVar9 & 0x3f) & 1) == 0) {
          if ((0x28a00000000U >> (uVar9 & 0x3f) & 1) == 0) {
            if (uVar9 != 0) goto LAB_0011814d;
            if (!bVar4 && common->has_set_som != 0) {
              if (compiler->error == 0) {
                iVar1 = common->ovector_start;
                compiler->mode32 = 0;
                cc = (PCRE2_SPTR16)&DAT_00000001;
                psVar7 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1);
                if (psVar7 != (sljit_u8 *)0x0) {
                  *psVar7 = 0x8b;
                }
                if (compiler->error == 0) {
                  iVar1 = common->ovector_start;
                  compiler->mode32 = 0;
                  cc = (PCRE2_SPTR16)0x8c;
                  emit_mov(compiler,0x8c,lVar10,0x40,-(long)iVar1);
                  if (compiler->error == 0) {
                    compiler->mode32 = 0;
                    cc = (PCRE2_SPTR16)&DAT_00000001;
                    psVar7 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(iVar11 + -8));
                    if (psVar7 != (sljit_u8 *)0x0) {
                      *psVar7 = 0x89;
                    }
                  }
                }
              }
              iVar11 = iVar11 + -0x10;
              bVar4 = bVar3;
            }
            iVar1 = common->mark_ptr;
            if (!bVar2 && (long)iVar1 != 0) {
              if (compiler->error == 0) {
                compiler->mode32 = 0;
                cc = (PCRE2_SPTR16)&DAT_00000001;
                psVar7 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1);
                if (psVar7 != (sljit_u8 *)0x0) {
                  *psVar7 = 0x8b;
                }
                if (compiler->error == 0) {
                  iVar1 = common->mark_ptr;
                  compiler->mode32 = 0;
                  cc = (PCRE2_SPTR16)0x8c;
                  emit_mov(compiler,0x8c,(long)iVar11,0x40,-(long)iVar1);
                  if (compiler->error == 0) {
                    compiler->mode32 = 0;
                    cc = (PCRE2_SPTR16)&DAT_00000001;
                    psVar7 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(iVar11 + -8));
                    if (psVar7 != (sljit_u8 *)0x0) {
                      *psVar7 = 0x89;
                    }
                  }
                }
              }
              iVar11 = iVar11 + -0x10;
              bVar2 = bVar3;
            }
            iVar1 = common->capture_last_ptr;
            if (!bVar5 && (long)iVar1 != 0) {
              if (compiler->error == 0) {
                compiler->mode32 = 0;
                cc = (PCRE2_SPTR16)&DAT_00000001;
                psVar7 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1);
                if (psVar7 != (sljit_u8 *)0x0) {
                  *psVar7 = 0x8b;
                }
                if (compiler->error == 0) {
                  iVar1 = common->capture_last_ptr;
                  compiler->mode32 = 0;
                  cc = (PCRE2_SPTR16)0x8c;
                  emit_mov(compiler,0x8c,(long)iVar11,0x40,-(long)iVar1);
                  if (compiler->error == 0) {
                    compiler->mode32 = 0;
                    cc = (PCRE2_SPTR16)&DAT_00000001;
                    psVar7 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(iVar11 + -8));
                    if (psVar7 != (sljit_u8 *)0x0) {
                      *psVar7 = 0x89;
                    }
                  }
                }
              }
              iVar11 = iVar11 + -0x10;
              bVar5 = true;
            }
            common_00 = (compiler_common *)((long)&common_00->compiler + 4);
          }
          else {
            if (!bVar2) {
              if (compiler->error == 0) {
                iVar1 = common->mark_ptr;
                compiler->mode32 = 0;
                cc = (PCRE2_SPTR16)&DAT_00000001;
                psVar7 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1);
                if (psVar7 != (sljit_u8 *)0x0) {
                  *psVar7 = 0x8b;
                }
                if (compiler->error == 0) {
                  iVar1 = common->mark_ptr;
                  compiler->mode32 = 0;
                  cc = (PCRE2_SPTR16)0x8c;
                  emit_mov(compiler,0x8c,lVar10,0x40,-(long)iVar1);
                  if (compiler->error == 0) {
                    compiler->mode32 = 0;
                    cc = (PCRE2_SPTR16)&DAT_00000001;
                    psVar7 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(iVar11 + -8));
                    if (psVar7 != (sljit_u8 *)0x0) {
                      *psVar7 = 0x89;
                    }
                  }
                }
              }
              iVar11 = iVar11 + -0x10;
            }
            common_00 = (compiler_common *)
                        ((long)&common_00->compiler +
                        (ulong)*(ushort *)((long)&common_00->compiler + 2) * 2 + 6);
            bVar2 = bVar3;
          }
        }
        else {
          iVar1 = common->capture_last_ptr;
          iVar6 = compiler->error;
          if (!bVar5 && (long)iVar1 != 0) {
            if (iVar6 == 0) {
              compiler->mode32 = 0;
              cc = (PCRE2_SPTR16)&DAT_00000001;
              psVar7 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1);
              if (psVar7 != (sljit_u8 *)0x0) {
                *psVar7 = 0x8b;
              }
              if (compiler->error == 0) {
                iVar1 = common->capture_last_ptr;
                compiler->mode32 = 0;
                cc = (PCRE2_SPTR16)0x8c;
                emit_mov(compiler,0x8c,lVar10,0x40,-(long)iVar1);
                if (compiler->error == 0) {
                  compiler->mode32 = 0;
                  cc = (PCRE2_SPTR16)&DAT_00000001;
                  psVar7 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(iVar11 + -8));
                  if (psVar7 != (sljit_u8 *)0x0) {
                    *psVar7 = 0x89;
                  }
                }
              }
            }
            iVar11 = iVar11 + -0x10;
            iVar6 = compiler->error;
            bVar5 = true;
          }
          if (iVar6 == 0) {
            lVar10 = (ulong)*(ushort *)((long)&common_00->compiler + 4) * 0x10;
            iVar1 = common->ovector_start;
            compiler->mode32 = 0;
            cc = (PCRE2_SPTR16)0x8c;
            emit_mov(compiler,0x8c,(long)iVar11,0x40,iVar1 + lVar10);
            if (compiler->error == 0) {
              iVar1 = common->ovector_start;
              compiler->mode32 = 0;
              cc = (PCRE2_SPTR16)&DAT_00000001;
              psVar7 = emit_x86_instruction(compiler,1,1,0,0x8e,iVar1 + lVar10);
              if (psVar7 != (sljit_u8 *)0x0) {
                *psVar7 = 0x8b;
              }
              if (compiler->error == 0) {
                iVar1 = common->ovector_start;
                compiler->mode32 = 0;
                cc = (PCRE2_SPTR16)&DAT_00000001;
                psVar7 = emit_x86_instruction(compiler,1,4,0,0x8e,iVar1 + lVar10 + 8);
                if (psVar7 != (sljit_u8 *)0x0) {
                  *psVar7 = 0x8b;
                }
                if (compiler->error == 0) {
                  compiler->mode32 = 0;
                  cc = (PCRE2_SPTR16)&DAT_00000001;
                  psVar7 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(iVar11 + -8));
                  if (psVar7 != (sljit_u8 *)0x0) {
                    *psVar7 = 0x89;
                  }
                  if (compiler->error == 0) {
                    compiler->mode32 = 0;
                    cc = (PCRE2_SPTR16)&DAT_00000001;
                    psVar7 = emit_x86_instruction(compiler,1,4,0,0x8c,(long)(iVar11 + -0x10));
                    if (psVar7 != (sljit_u8 *)0x0) {
                      *psVar7 = 0x89;
                    }
                  }
                }
              }
            }
          }
          iVar11 = iVar11 + -0x18;
          common_00 = (compiler_common *)((long)&common_00->compiler + 6);
        }
      }
      else {
LAB_0011814d:
        if (*(ushort *)&common_00->compiler == 3) {
          if (!bVar4) {
            if (compiler->error == 0) {
              iVar1 = common->ovector_start;
              compiler->mode32 = 0;
              cc = (PCRE2_SPTR16)&DAT_00000001;
              psVar7 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1);
              if (psVar7 != (sljit_u8 *)0x0) {
                *psVar7 = 0x8b;
              }
              if (compiler->error == 0) {
                iVar1 = common->ovector_start;
                compiler->mode32 = 0;
                cc = (PCRE2_SPTR16)0x8c;
                emit_mov(compiler,0x8c,lVar10,0x40,-(long)iVar1);
                if (compiler->error == 0) {
                  compiler->mode32 = 0;
                  cc = (PCRE2_SPTR16)&DAT_00000001;
                  psVar7 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(iVar11 + -8));
                  if (psVar7 != (sljit_u8 *)0x0) {
                    *psVar7 = 0x89;
                  }
                }
              }
            }
            iVar11 = iVar11 + -0x10;
          }
          common_00 = (compiler_common *)((long)&common_00->compiler + 2);
          bVar4 = bVar3;
        }
        else {
          common_00 = (compiler_common *)next_opcode(common_00,cc);
        }
      }
    } while (common_00 < ccend);
  }
  if (compiler->error == 0) {
    compiler->mode32 = 0;
    psVar7 = emit_x86_instruction(compiler,1,0x40,0,0x8c,(long)iVar11);
    if (psVar7 != (sljit_u8 *)0x0) {
      *psVar7 = 199;
    }
  }
  return;
}

Assistant:

static void init_frame(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend, int stackpos, int stacktop)
{
DEFINE_COMPILER;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
/* The last capture is a local variable even for recursions. */
BOOL capture_last_found = FALSE;
int offset;

/* >= 1 + shortest item size (2) */
SLJIT_UNUSED_ARG(stacktop);
SLJIT_ASSERT(stackpos >= stacktop + 2);

stackpos = STACK(stackpos);
if (ccend == NULL)
  {
  ccend = bracketend(cc) - (1 + LINK_SIZE);
  if (*cc != OP_CBRAPOS && *cc != OP_SCBRAPOS)
    cc = next_opcode(common, cc);
  }

SLJIT_ASSERT(cc != NULL);
while (cc < ccend)
  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    if (!setsom_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -OVECTOR(0));
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setsom_found = TRUE;
      }
    cc += 1;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (!setmark_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->mark_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setmark_found = TRUE;
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_RECURSE:
    if (common->has_set_som && !setsom_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -OVECTOR(0));
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setsom_found = TRUE;
      }
    if (common->mark_ptr != 0 && !setmark_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->mark_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setmark_found = TRUE;
      }
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->capture_last_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      capture_last_found = TRUE;
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_CBRAPOS:
    case OP_SCBRA:
    case OP_SCBRAPOS:
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->capture_last_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      capture_last_found = TRUE;
      }
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, OVECTOR(offset));
    stackpos -= (int)sizeof(sljit_sw);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
    stackpos -= (int)sizeof(sljit_sw);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP2, 0);
    stackpos -= (int)sizeof(sljit_sw);

    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }

OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, 0);
SLJIT_ASSERT(stackpos == STACK(stacktop));
}